

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O2

unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
__thiscall
gurkenlaeufer::CommonParserState::forwardToNextState
          (CommonParserState *this,string *trimmedLine,
          list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *backgroundSteps)

{
  long *plVar1;
  _List_node_header *in_RCX;
  pointer *__ptr;
  IParserState local_48;
  IParserState local_40;
  _List_node_header local_38;
  
  plVar1 = (long *)trimmedLine->_M_string_length;
  std::__detail::_List_node_header::_List_node_header(&local_38,in_RCX);
  (**(code **)(*plVar1 + 0x10))(&local_48,plVar1,&local_38);
  std::__cxx11::_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::_M_clear
            ((_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *)&local_38);
  (**(code **)(*local_48._vptr_IParserState + 0x10))
            (&local_40,local_48._vptr_IParserState,backgroundSteps);
  if (local_40._vptr_IParserState == (_func_int **)0x0) {
    (this->super_IParserState)._vptr_IParserState = local_48._vptr_IParserState;
  }
  else {
    (this->super_IParserState)._vptr_IParserState = local_40._vptr_IParserState;
    if (local_48._vptr_IParserState != (_func_int **)0x0) {
      (**(code **)(*local_48._vptr_IParserState + 8))();
    }
  }
  return (__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
          )(__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IParserState> forwardToNextState(const std::string& trimmedLine, std::list<Step> backgroundSteps) const
    {
        auto initState = _factory.createInitialState(std::move(backgroundSteps));
        auto nextState = initState->parseLine(trimmedLine);
        if (nextState != nullptr) {
            return nextState;
        }
        return initState;
    }